

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CInterfaceIOWrapper.cpp
# Opt level: O0

IOStream * __thiscall Assimp::CIOSystemWrapper::Open(CIOSystemWrapper *this,char *pFile,char *pMode)

{
  aiFile *pFile_00;
  aiFile *p;
  char *pMode_local;
  char *pFile_local;
  CIOSystemWrapper *this_local;
  
  pFile_00 = (*this->mFileSystem->OpenProc)(this->mFileSystem,pFile,pMode);
  if (pFile_00 == (aiFile *)0x0) {
    this_local = (CIOSystemWrapper *)0x0;
  }
  else {
    this_local = (CIOSystemWrapper *)
                 Intern::AllocateFromAssimpHeap::operator_new
                           ((AllocateFromAssimpHeap *)0x18,(size_t)pFile);
    CIOStreamWrapper::CIOStreamWrapper((CIOStreamWrapper *)this_local,pFile_00,this);
  }
  return (IOStream *)this_local;
}

Assistant:

IOStream* CIOSystemWrapper::Open(const char* pFile,const char* pMode) {
    aiFile* p = mFileSystem->OpenProc(mFileSystem,pFile,pMode);
    if (!p) {
        return NULL;
    }
    return new CIOStreamWrapper(p, this);
}